

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

int print_opcode(int pc,DLbyte *addr,fnhead *fnobj)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  LispPTR index;
  uint uVar4;
  DLbyte *pDVar5;
  ulong uVar6;
  bool bVar7;
  
  bVar1 = *(byte *)((ulong)addr ^ 3);
  uVar3 = (ulong)bVar1;
  uVar4 = oplength[uVar3] + 1;
  printf(" 0%04o (0x%04x)    ",pc);
  uVar6 = 0;
  pDVar5 = addr;
  uVar2 = uVar6;
  if (0 < (int)uVar4) {
    uVar6 = (ulong)uVar4;
    uVar2 = uVar6;
  }
  while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
    printf("%4o",(ulong)*(byte *)((ulong)pDVar5 ^ 3));
    pDVar5 = pDVar5 + 1;
  }
  for (; (uint)uVar2 < 9; uVar2 = (ulong)((uint)uVar2 + 1)) {
    printf("    ");
  }
  printf("%s",opcode_table[uVar3]);
  switch(uVar3) {
  case 0:
    putchar(10);
    return -1;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 7:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x7d:
  case 0x7e:
  case 0x7f:
    goto switchD_0012c184_caseD_1;
  case 6:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0x17:
  case 0x2e:
  case 0x60:
  case 0x67:
    goto switchD_0012c184_caseD_6;
  case 0xd:
    addr = addr + 1;
    printf("(%d)",(ulong)*(byte *)((ulong)addr ^ 3));
    goto switchD_0012c184_caseD_6;
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
    putchar(0x20);
    index = get_fn_fvar_name(fnobj,bVar1 - 0x50);
    goto LAB_0012c28d;
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
    uVar2 = (ulong)((pc + (uint)bVar1) - 0x7e);
    break;
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
    uVar2 = (ulong)((pc + (uint)bVar1) - 0x8e);
    break;
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xa4:
  case 0xa5:
  case 0xa6:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
    uVar2 = (ulong)((pc + (uint)bVar1) - 0x9e);
    break;
  case 0xb0:
  case 0xb2:
  case 0xb3:
  case 0xb4:
  case 0xb5:
    uVar2 = (ulong)(uint)(*(char *)((ulong)(addr + 1) ^ 3) + pc);
    break;
  case 0xb1:
    uVar2 = (ulong)(pc + (uint)*(byte *)((ulong)(addr + 2) ^ 3) +
                   *(char *)((ulong)(addr + 1) ^ 3) * 0x100);
    break;
  default:
    if (bVar1 == 0xc3) goto switchD_0012c184_caseD_6;
switchD_0012c184_caseD_1:
    putchar(10);
    goto LAB_0012c29a;
  }
  printf(" 0%o (0x%x)\n",uVar2);
LAB_0012c29a:
  fflush(_stdout);
  return uVar4;
switchD_0012c184_caseD_6:
  putchar(0x20);
  index = (uint)*(byte *)((ulong)(addr + 4) ^ 3) |
          (uint)*(byte *)((ulong)(addr + 3) ^ 3) << 8 |
          (uint)*(byte *)((ulong)(addr + 2) ^ 3) << 0x10 |
          (uint)*(byte *)((ulong)(addr + 1) ^ 3) << 0x18;
LAB_0012c28d:
  print_atomname(index);
  goto switchD_0012c184_caseD_1;
}

Assistant:

int print_opcode(int pc, DLbyte *addr, struct fnhead *fnobj) {
  /* Print the opcode at addr, including args, and return length */
  /* if this opcode is the last, return -1			   */
  int op = (int)(0xFF & GETBYTE(addr));
  int i;
  extern unsigned int oplength[256];
  int len = oplength[op] + 1;

  printf(" 0%04o (0x%04x)    ", pc, pc);
  for (i = 0; i < len; i++) printf("%4o", 0xFF & GETBYTE(addr + i));
  for (; i < 9; i++) printf("    ");
  printf("%s", opcode_table[op]);

  switch (op) {
    case 0:
      putchar('\n'); /* End of function */
      return (-1);
    case 015:
      printf("(%d)", (unsigned char)GETBYTE(addr + 1));
      addr += 1; /* FNX uses an extra byte */
                 /* Fall thru to the name print */
    case 006:    /* DTEST */
    case 010:    /* FN0-4 */
    case 011:
    case 012:
    case 013:
    case 014:
    case 027:  /* GVAR_ */
    case 0140: /* GVAR */
    case 0303: /* INSTANCEP */
    case 056:  /* TYPENAMEP */
    case 0147: putchar(' ');
#ifdef BIGVM
      print_atomname(((unsigned char)GETBYTE(addr + 1) << 24) +
                     ((unsigned char)GETBYTE(addr + 2) << 16) +
                     ((unsigned char)GETBYTE(addr + 3) << 8) + (unsigned char)GETBYTE(addr + 4));
#elif defined(BIGATOMS)
      print_atomname(((unsigned char)GETBYTE(addr + 1) << 16) +
                     ((unsigned char)GETBYTE(addr + 2) << 8) + (unsigned char)GETBYTE(addr + 3));
#else
      print_atomname(((unsigned char)GETBYTE(addr + 1) << 8) + (unsigned char)GETBYTE(addr + 2));
#endif /* BIGATOMS */

      putchar('\n');
      break;
    case 0200: /* Jump opcodes */
    case 0201:
    case 0202:
    case 0203:
    case 0204:
    case 0205:
    case 0206:
    case 0207:
    case 0210:
    case 0211:
    case 0212:
    case 0213:
    case 0214:
    case 0215:
    case 0216:
    case 0217: printf(" 0%o (0x%x)\n", pc + 2 + op - 0200, pc + 2 + op - 0200); break;
    case 0220: /* FJUMP opcodes */
    case 0221:
    case 0222:
    case 0223:
    case 0224:
    case 0225:
    case 0226:
    case 0227:
    case 0230:
    case 0231:
    case 0232:
    case 0233:
    case 0234:
    case 0235:
    case 0236:
    case 0237: printf(" 0%o (0x%x)\n", pc + 2 + op - 0220, pc + 2 + op - 0220); break;
    case 0240: /* TJUMP opcodes */
    case 0241:
    case 0242:
    case 0243:
    case 0244:
    case 0245:
    case 0246:
    case 0247:
    case 0250:
    case 0251:
    case 0252:
    case 0253:
    case 0254:
    case 0255:
    case 0256:
    case 0257: printf(" 0%o (0x%x)\n", pc + 2 + op - 0240, pc + 2 + op - 0240); break;
    case 0260: /* JUMPX */
    case 0262: /* FJUMPX */
    case 0263: /* TJUMPX */
    case 0264: /* NFJUMPX */
    case 0265: /* NTJUMPX */
      printf(" 0%o (0x%x)\n", pc + (int8_t)GETBYTE(addr + 1), pc + (int8_t)GETBYTE(addr + 1));
      break;
    case 0261: /* JUMPXX */
      printf(" 0%o (0x%x)\n",
             pc + ((int8_t)GETBYTE(addr + 1) << 8) + (uint8_t)GETBYTE(addr + 2),
             pc + ((int8_t)GETBYTE(addr + 1) << 8) + (uint8_t)GETBYTE(addr + 2));
      break;
    case 0120: /* FVAR opcodes */
    case 0121:
    case 0122:
    case 0123:
    case 0124:
    case 0125:
    case 0126:
      putchar(' ');
      print_atomname(get_fn_fvar_name(fnobj, op - 0120));
      putchar('\n');
      break;
    default: putchar('\n');
  }
  fflush(stdout); /* Make sure each line is really printed as we go. */
  return (len);
}